

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode Curl_multi_pollset_ev
                    (Curl_multi *multi,Curl_easy *data,easy_pollset *ps,easy_pollset *last_ps)

{
  int *piVar1;
  Curl_hash *pCVar2;
  bool bVar3;
  int iVar4;
  Curl_hash *pCVar5;
  void *pvVar6;
  easy_pollset *peVar7;
  byte bVar8;
  ulong uVar9;
  size_t key_len;
  ulong uVar10;
  Curl_easy **key;
  uint uVar11;
  int iVar12;
  int local_60;
  uint local_5c;
  easy_pollset *local_58;
  Curl_easy *local_50;
  int local_44;
  Curl_hash *local_40;
  Curl_multi *local_38;
  
  local_58 = last_ps;
  local_50 = data;
  if (ps->num != 0) {
    local_40 = &multi->sockhash;
    uVar10 = 0;
    local_38 = multi;
    do {
      pCVar2 = local_40;
      iVar4 = ps->sockets[uVar10];
      local_60 = iVar4;
      if (iVar4 == -1) {
        local_44 = -1;
        uVar11 = (uint)ps->actions[uVar10];
LAB_00144ede:
        pCVar5 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (pCVar5 == (Curl_hash *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_hash_init(pCVar5,0xd,trhash,trhash_compare,trhash_dtor);
        pvVar6 = Curl_hash_add(pCVar2,&local_44,4,pCVar5);
        if (pvVar6 == (void *)0x0) {
          Curl_hash_destroy(pCVar5);
          (*Curl_cfree)(pCVar5);
          return CURLM_OUT_OF_MEMORY;
        }
      }
      else {
        local_5c = (uint)ps->actions[uVar10];
        pCVar5 = (Curl_hash *)Curl_hash_pick(local_40,&local_60,4);
        if (pCVar5 == (Curl_hash *)0x0) {
          local_60 = iVar4;
          local_44 = iVar4;
          pCVar5 = (Curl_hash *)Curl_hash_pick(pCVar2,&local_60,4);
          uVar11 = local_5c;
          if (pCVar5 == (Curl_hash *)0x0) goto LAB_00144ede;
        }
        else {
          uVar11 = local_5c;
          if ((ulong)local_58->num != 0) {
            uVar9 = 0;
            do {
              if (iVar4 == local_58->sockets[uVar9]) {
                bVar8 = local_58->actions[uVar9];
                if (bVar8 != 0) {
                  if (bVar8 != (byte)local_5c) {
                    if ((bVar8 & 1) != 0) {
                      *(int *)&pCVar5[1].comp_func = *(int *)&pCVar5[1].comp_func + -1;
                    }
                    if ((bVar8 & 2) != 0) {
                      piVar1 = (int *)((long)&pCVar5[1].comp_func + 4);
                      *piVar1 = *piVar1 + -1;
                    }
                    if ((local_5c & 1) != 0) {
                      *(int *)&pCVar5[1].comp_func = *(int *)&pCVar5[1].comp_func + 1;
                    }
                    if ((local_5c & 2) != 0) {
                      piVar1 = (int *)((long)&pCVar5[1].comp_func + 4);
                      *piVar1 = *piVar1 + 1;
                    }
                  }
                  bVar3 = false;
                  goto LAB_00144ffd;
                }
                break;
              }
              uVar9 = uVar9 + 1;
            } while (local_58->num != uVar9);
          }
        }
      }
      pvVar6 = Curl_hash_pick(pCVar5,&local_50,8);
      bVar3 = true;
      if (pvVar6 == (void *)0x0) {
        piVar1 = (int *)((long)&pCVar5[1].table + 4);
        *piVar1 = *piVar1 + 1;
        if ((uVar11 & 1) != 0) {
          *(int *)&pCVar5[1].comp_func = *(int *)&pCVar5[1].comp_func + 1;
        }
        if ((uVar11 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar5[1].comp_func + 4);
          *piVar1 = *piVar1 + 1;
        }
        pvVar6 = Curl_hash_add(pCVar5,&local_50,8,local_50);
        if (pvVar6 == (void *)0x0) {
          Curl_hash_destroy(pCVar5);
          return CURLM_OUT_OF_MEMORY;
        }
      }
LAB_00144ffd:
      multi = local_38;
      iVar12 = (uint)(*(int *)&pCVar5[1].comp_func != 0) +
               (uint)(*(int *)((long)&pCVar5[1].comp_func + 4) != 0) * 2;
      if ((bVar3) || (*(int *)&pCVar5[1].table != iVar12)) {
        if (local_38->socket_cb != (curl_socket_callback)0x0) {
          local_38->field_0x279 = local_38->field_0x279 | 4;
          iVar4 = (*local_38->socket_cb)
                            (local_50,iVar4,iVar12,local_38->socket_userp,pCVar5[1].hash_func);
          bVar8 = multi->field_0x279 & 0xfb;
          multi->field_0x279 = bVar8;
          if (iVar4 == -1) {
            multi->field_0x279 = bVar8 | 0x10;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        *(int *)&pCVar5[1].table = iVar12;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < ps->num);
  }
  if (local_58->num != 0) {
    pCVar2 = &multi->sockhash;
    uVar10 = 0;
    peVar7 = local_58;
    do {
      iVar4 = peVar7->sockets[uVar10];
      if ((ulong)ps->num != 0) {
        uVar9 = 0;
        do {
          if (iVar4 == ps->sockets[uVar9]) goto LAB_0014518b;
          uVar9 = uVar9 + 1;
        } while (ps->num != uVar9);
      }
      if ((iVar4 != -1) &&
         (local_60 = iVar4, pCVar5 = (Curl_hash *)Curl_hash_pick(pCVar2,&local_60,4),
         peVar7 = local_58, pCVar5 != (Curl_hash *)0x0)) {
        bVar8 = local_58->actions[uVar10];
        iVar12 = *(int *)((long)&pCVar5[1].table + 4) + -1;
        *(int *)((long)&pCVar5[1].table + 4) = iVar12;
        if ((bVar8 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar5[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar8 & 1) != 0) {
          *(int *)&pCVar5[1].comp_func = *(int *)&pCVar5[1].comp_func + -1;
        }
        if (iVar12 == 0) {
          if (multi->socket_cb != (curl_socket_callback)0x0) {
            multi->field_0x279 = multi->field_0x279 | 4;
            local_5c = (*multi->socket_cb)(local_50,iVar4,4,multi->socket_userp,pCVar5[1].hash_func)
            ;
            multi->field_0x279 = multi->field_0x279 & 0xfb;
            local_60 = iVar4;
            Curl_hash_destroy(pCVar5);
            Curl_hash_delete(pCVar2,&local_60,4);
            peVar7 = local_58;
            if (local_5c == 0xffffffff) {
              multi->field_0x279 = multi->field_0x279 | 0x10;
              return CURLM_ABORTED_BY_CALLBACK;
            }
            goto LAB_0014518b;
          }
          local_60 = iVar4;
          Curl_hash_destroy(pCVar5);
          key_len = 4;
          key = (Curl_easy **)&local_60;
          pCVar5 = pCVar2;
        }
        else {
          key_len = 8;
          key = &local_50;
        }
        Curl_hash_delete(pCVar5,key,key_len);
        peVar7 = local_58;
      }
LAB_0014518b:
      uVar10 = uVar10 + 1;
    } while (uVar10 < peVar7->num);
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_multi_pollset_ev(struct Curl_multi *multi,
                                struct Curl_easy *data,
                                struct easy_pollset *ps,
                                struct easy_pollset *last_ps)
{
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < ps->num; i++) {
    unsigned char cur_action = ps->actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = ps->sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j < last_ps->num; j++) {
        if(s == last_ps->sockets[j]) {
          last_action = last_ps->actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we did not have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN) {
        DEBUGASSERT(entry->readers);
        entry->readers--;
      }
      if(last_action & CURL_POLL_OUT) {
        DEBUGASSERT(entry->writers);
        entry->writers--;
      }
      if(cur_action & CURL_POLL_IN) {
        entry->readers++;
      }
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action &&
            !Curl_hash_pick(&entry->transfers, (char *)&data, /* hash key */
                            sizeof(struct Curl_easy *))) {
      DEBUGASSERT(entry->users < 100000); /* detect weird values */
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    /* store the current action state */
    entry->action = (unsigned int)comboaction;
  }

  /* Check for last_poll.sockets that no longer appear in ps->sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i < last_ps->num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = last_ps->sockets[i];
    for(j = 0; j < ps->num; j++) {
      if(s == ps->sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = last_ps->actions[i];
      /* this socket has been removed. Decrease user count */
      DEBUGASSERT(entry->users);
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        bool dead = FALSE;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1)
            dead = TRUE;
        }
        sh_delentry(entry, &multi->sockhash, s);
        if(dead) {
          multi->dead = TRUE;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  return CURLM_OK;
}